

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.h
# Opt level: O2

SQObjectPtr * __thiscall SQObjectPtr::operator=(SQObjectPtr *this,bool b)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  
  if (((this->super_SQObject)._type & 0x8000000) != 0) {
    pSVar1 = &(((this->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(((this->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  (this->super_SQObject)._type = OT_BOOL;
  (this->super_SQObject)._flags = '\0';
  SVar2.nInteger._1_7_ = 0;
  SVar2.nInteger._0_1_ = b;
  (this->super_SQObject)._unVal = SVar2;
  return this;
}

Assistant:

inline SQObjectPtr& operator=(bool b)
    {
        __Release(_type,_unVal);
        SQ_OBJECT_RAWINIT()
        _type = OT_BOOL;
        _flags = 0;
        _unVal.nInteger = b?1:0;
        return *this;
    }